

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleigh.cc
# Opt level: O0

int4 __thiscall Sleigh::oneInstruction(Sleigh *this,PcodeEmit *emit,Address *baseaddr)

{
  PcodeCacher **this_00;
  DisassemblyCache *dcache;
  ParserContext *this_01;
  int4 iVar1;
  int iVar2;
  uintb uVar3;
  ostream *s_00;
  UnimplError *this_02;
  Address *pAVar4;
  AddrSpace *cspc;
  AddrSpace *uspc;
  Constructor *this_03;
  ConstructTpl *construct;
  Constructor *ct;
  ParserWalker *cur;
  ostringstream s_1;
  UnimplError *err;
  SleighBuilder builder;
  ParserWalker walker;
  undefined1 local_200 [4];
  int4 len;
  ParserContext *local_1f0;
  ParserContext *delaypos;
  ParserContext *pPStack_1e0;
  int4 bytecount;
  ParserContext *pos;
  string local_1d0 [48];
  ostringstream local_1a0 [8];
  ostringstream s;
  int local_24;
  int4 fallOffset;
  Address *baseaddr_local;
  PcodeEmit *emit_local;
  Sleigh *this_local;
  
  if (((this->super_SleighBase).super_Translate.alignment != 1) &&
     (uVar3 = Address::getOffset(baseaddr),
     uVar3 % (ulong)(long)(this->super_SleighBase).super_Translate.alignment != 0)) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    s_00 = std::operator<<((ostream *)local_1a0,"Instruction address not aligned: ");
    ::operator<<(s_00,baseaddr);
    pos._7_1_ = 1;
    this_02 = (UnimplError *)__cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    UnimplError::UnimplError(this_02,local_1d0,0);
    pos._7_1_ = 0;
    __cxa_throw(this_02,&UnimplError::typeinfo,UnimplError::~UnimplError);
  }
  pPStack_1e0 = obtainContext(this,baseaddr,2);
  ParserContext::applyCommits(pPStack_1e0);
  local_24 = ParserContext::getLength(pPStack_1e0);
  iVar1 = ParserContext::getDelaySlot(pPStack_1e0);
  if (0 < iVar1) {
    delaypos._4_4_ = 0;
    do {
      pAVar4 = ParserContext::getAddr(pPStack_1e0);
      Address::operator+((Address *)local_200,(int4)pAVar4);
      local_1f0 = obtainContext(this,(Address *)local_200,2);
      ParserContext::applyCommits(local_1f0);
      iVar1 = ParserContext::getLength(local_1f0);
      local_24 = iVar1 + local_24;
      iVar2 = iVar1 + delaypos._4_4_;
      delaypos._4_4_ = iVar2;
      iVar1 = ParserContext::getDelaySlot(pPStack_1e0);
      this_01 = pPStack_1e0;
    } while (iVar2 < iVar1);
    pAVar4 = ParserContext::getAddr(pPStack_1e0);
    Address::operator+((Address *)(walker.breadcrumb + 0x1f),(int4)pAVar4);
    ParserContext::setNaddr(this_01,(Address *)(walker.breadcrumb + 0x1f));
  }
  this_00 = &builder.cache;
  ParserWalker::ParserWalker((ParserWalker *)this_00,pPStack_1e0);
  ParserWalker::baseState((ParserWalker *)this_00);
  PcodeCacher::clear(&this->pcode_cache);
  dcache = this->discache;
  cspc = AddrSpaceManager::getConstantSpace((AddrSpaceManager *)this);
  uspc = AddrSpaceManager::getUniqueSpace((AddrSpaceManager *)this);
  SleighBuilder::SleighBuilder
            ((SleighBuilder *)&err,(ParserWalker *)this_00,dcache,&this->pcode_cache,cspc,uspc,
             (this->super_SleighBase).unique_allocatemask);
  this_03 = ParserWalker::getConstructor((ParserWalker *)this_00);
  construct = Constructor::getTempl(this_03);
  PcodeBuilder::build((PcodeBuilder *)&err,construct,-1);
  PcodeCacher::resolveRelatives(&this->pcode_cache);
  PcodeCacher::emit(&this->pcode_cache,baseaddr,emit);
  SleighBuilder::~SleighBuilder((SleighBuilder *)&err);
  return local_24;
}

Assistant:

int4 Sleigh::oneInstruction(PcodeEmit &emit,const Address &baseaddr) const

{
  int4 fallOffset;
  if (alignment != 1) {
    if ((baseaddr.getOffset() % alignment)!=0) {
      ostringstream s;
      s << "Instruction address not aligned: " << baseaddr;
      throw UnimplError(s.str(),0);
    }
  }
  
  ParserContext *pos = obtainContext(baseaddr,ParserContext::pcode);
  pos->applyCommits();
  fallOffset = pos->getLength();
  
  if (pos->getDelaySlot()>0) {
    int4 bytecount = 0;
    do {
    // Do not pass pos->getNaddr() to obtainContext, as pos may have been previously cached and had naddr adjusted
      ParserContext *delaypos = obtainContext(pos->getAddr() + fallOffset,ParserContext::pcode);
      delaypos->applyCommits();
      int4 len = delaypos->getLength();
      fallOffset += len;
      bytecount += len;
    } while(bytecount < pos->getDelaySlot());
    pos->setNaddr(pos->getAddr()+fallOffset);
  }
  ParserWalker walker(pos);
  walker.baseState();
  pcode_cache.clear();
  SleighBuilder builder(&walker,discache,&pcode_cache,getConstantSpace(),getUniqueSpace(),unique_allocatemask);
  try {
    builder.build(walker.getConstructor()->getTempl(),-1);
    pcode_cache.resolveRelatives();
    pcode_cache.emit(baseaddr,&emit);
  } catch(UnimplError &err) {
    ostringstream s;
    s << "Instruction not implemented in pcode:\n ";
    ParserWalker *cur = builder.getCurrentWalker();
    cur->baseState();
    Constructor *ct = cur->getConstructor();
    cur->getAddr().printRaw(s);
    s << ": ";
    ct->printMnemonic(s,*cur);
    s << "  ";
    ct->printBody(s,*cur);
    err.explain = s.str();
    err.instruction_length = fallOffset;
    throw err;
  }
  return fallOffset;
}